

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_array.h
# Opt level: O3

void __thiscall
agg::pod_bvector<agg::vertex_dist,_6U>::allocate_block
          (pod_bvector<agg::vertex_dist,_6U> *this,uint nb)

{
  vertex_dist **__src;
  vertex_dist **__dest;
  vertex_dist *pvVar1;
  uint uVar2;
  
  if (nb < this->m_max_blocks) {
    __dest = this->m_blocks;
  }
  else {
    uVar2 = this->m_max_blocks + this->m_block_ptr_inc;
    __dest = (vertex_dist **)operator_new__((ulong)uVar2 * 8);
    __src = this->m_blocks;
    if (__src != (vertex_dist **)0x0) {
      memcpy(__dest,__src,(ulong)this->m_num_blocks << 3);
      operator_delete__(__src);
      uVar2 = this->m_max_blocks + this->m_block_ptr_inc;
    }
    this->m_blocks = __dest;
    this->m_max_blocks = uVar2;
  }
  pvVar1 = (vertex_dist *)operator_new__(0x600);
  __dest[nb] = pvVar1;
  this->m_num_blocks = this->m_num_blocks + 1;
  return;
}

Assistant:

void pod_bvector<T, S>::allocate_block(unsigned nb)
    {
        if(nb >= m_max_blocks) 
        {
            T** new_blocks = pod_allocator<T*>::allocate(m_max_blocks + m_block_ptr_inc);

            if(m_blocks)
            {
                memcpy(new_blocks, 
                       m_blocks, 
                       m_num_blocks * sizeof(T*));

                pod_allocator<T*>::deallocate(m_blocks, m_max_blocks);
            }
            m_blocks = new_blocks;
            m_max_blocks += m_block_ptr_inc;
        }
        m_blocks[nb] = pod_allocator<T>::allocate(block_size);
        m_num_blocks++;
    }